

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printBDLAddrOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  uint RegNo;
  sysz_reg sVar2;
  MCOperand *pMVar3;
  ulong uVar4;
  SStream *ss;
  char *pcVar5;
  uint8_t *puVar6;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint64_t Length;
  uint64_t Disp;
  uint Base;
  SStream *in_stack_ffffffffffffffc8;
  
  pMVar3 = MCInst_getOperand(in_RDI,in_ESI);
  RegNo = MCOperand_getReg(pMVar3);
  pMVar3 = MCInst_getOperand(in_RDI,in_ESI + 1);
  uVar4 = MCOperand_getImm(pMVar3);
  pMVar3 = MCInst_getOperand(in_RDI,in_ESI + 2);
  ss = (SStream *)MCOperand_getImm(pMVar3);
  if (uVar4 < 10) {
    SStream_concat(in_RDX,"%lu",uVar4);
  }
  else {
    SStream_concat(in_RDX,"0x%lx",uVar4);
  }
  if (ss < (SStream *)0xa) {
    SStream_concat(in_RDX,"(%lu",ss);
  }
  else {
    SStream_concat(in_RDX,"(0x%lx",ss);
  }
  if (RegNo != 0) {
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,", %%%s",pcVar5);
    in_stack_ffffffffffffffc8 = in_RDX;
  }
  SStream_concat0(ss,in_stack_ffffffffffffffc8->buffer);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar6 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar6[0] = '\x03';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    sVar2 = SystemZ_map_register(RegNo);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d] = (uint8_t)sVar2;
    *(SStream **)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x25) = ss;
    *(ulong *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x2d) = uVar4;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printBDLAddrOperand(MCInst *MI, int OpNum, SStream *O)
{
	unsigned Base = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	uint64_t Disp = (uint64_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));
	uint64_t Length = (uint64_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 2));

	if (Disp > HEX_THRESHOLD)
		SStream_concat(O, "0x%"PRIx64, Disp);
	else
		SStream_concat(O, "%"PRIu64, Disp);

	if (Length > HEX_THRESHOLD)
		SStream_concat(O, "(0x%"PRIx64, Length);
	else
		SStream_concat(O, "(%"PRIu64, Length);

	if (Base)
		SStream_concat(O, ", %%%s", getRegisterName(Base));
	SStream_concat0(O, ")");

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.length = Length;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = (int64_t)Disp;
		MI->flat_insn->detail->sysz.op_count++;
	}
}